

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5ExprAnd(Fts5Expr **pp1,Fts5Expr *p2)

{
  Fts5Expr *pFVar1;
  Fts5ExprNode *pFVar2;
  Fts5ExprPhrase **__src;
  long lVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  Fts5Parse local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.pExpr = (Fts5ExprNode *)0x0;
  local_68.bPhraseToAnd = 0;
  local_68._44_4_ = 0;
  local_68.rc = 0;
  local_68.nPhrase = 0;
  local_68.apPhrase = (Fts5ExprPhrase **)0x0;
  local_68.pConfig = (Fts5Config *)0x0;
  local_68.zErr = (char *)0x0;
  pFVar1 = *pp1;
  if (p2 == (Fts5Expr *)0x0 || pFVar1 == (Fts5Expr *)0x0) {
    iVar4 = 0;
    if (p2 != (Fts5Expr *)0x0) {
      *pp1 = p2;
    }
  }
  else {
    iVar5 = p2->nPhrase + pFVar1->nPhrase;
    pFVar2 = sqlite3Fts5ParseNode(&local_68,2,pFVar1->pRoot,p2->pRoot,(Fts5ExprNearset *)0x0);
    pFVar1->pRoot = pFVar2;
    p2->pRoot = (Fts5ExprNode *)0x0;
    iVar4 = local_68.rc;
    if (local_68.rc == 0) {
      __src = (Fts5ExprPhrase **)sqlite3_realloc(pFVar1->apExprPhrase,iVar5 * 8);
      if (__src == (Fts5ExprPhrase **)0x0) {
        iVar4 = 7;
      }
      else {
        memmove(__src + p2->nPhrase,__src,(long)pFVar1->nPhrase << 3);
        iVar4 = p2->nPhrase;
        for (lVar3 = 0; lVar3 < iVar4; lVar3 = lVar3 + 1) {
          __src[lVar3] = p2->apExprPhrase[lVar3];
        }
        pFVar1->nPhrase = iVar5;
        pFVar1->apExprPhrase = __src;
        iVar4 = 0;
      }
    }
    sqlite3_free(p2->apExprPhrase);
    sqlite3_free(p2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5ExprAnd(Fts5Expr **pp1, Fts5Expr *p2){
  Fts5Parse sParse;
  memset(&sParse, 0, sizeof(sParse));

  if( *pp1 && p2 ){
    Fts5Expr *p1 = *pp1;
    int nPhrase = p1->nPhrase + p2->nPhrase;

    p1->pRoot = sqlite3Fts5ParseNode(&sParse, FTS5_AND, p1->pRoot, p2->pRoot,0);
    p2->pRoot = 0;

    if( sParse.rc==SQLITE_OK ){
      Fts5ExprPhrase **ap = (Fts5ExprPhrase**)sqlite3_realloc(
          p1->apExprPhrase, nPhrase * sizeof(Fts5ExprPhrase*)
      );
      if( ap==0 ){
        sParse.rc = SQLITE_NOMEM;
      }else{
        int i;
        memmove(&ap[p2->nPhrase], ap, p1->nPhrase*sizeof(Fts5ExprPhrase*));
        for(i=0; i<p2->nPhrase; i++){
          ap[i] = p2->apExprPhrase[i];
        }
        p1->nPhrase = nPhrase;
        p1->apExprPhrase = ap;
      }
    }
    sqlite3_free(p2->apExprPhrase);
    sqlite3_free(p2);
  }else if( p2 ){
    *pp1 = p2;
  }

  return sParse.rc;
}